

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O2

void show_ast_node(Node *n,int indent)

{
  _func_int **pp_Var1;
  int iVar2;
  _func_int **pp_Var3;
  bool bVar4;
  
LAB_00103c8f:
  do {
    iVar2 = 0;
    if (0 < indent) {
      iVar2 = indent;
    }
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      printf("  ");
    }
    switch(n->kind) {
    case UnaryExpr:
      printf("UnaryExpr %c\n",(ulong)(uint)(int)(char)n->field_0xc);
      n = (Node *)n[1]._vptr_Node;
      break;
    case BinExpr:
      goto switchD_00103cc4_caseD_4;
    case Literal:
      printf("Literal %d\n",(ulong)*(uint *)&n->field_0xc);
      return;
    case Return:
      puts("Return");
      n = (Node *)n[1]._vptr_Node;
      if (n == (Node *)0x0) {
        return;
      }
      break;
    case CompoundStmt:
      puts("CompoundStmt");
      pp_Var1 = *(_func_int ***)&n[1].kind;
      for (pp_Var3 = n[1]._vptr_Node; pp_Var3 != pp_Var1; pp_Var3 = pp_Var3 + 1) {
        show_ast_node((Node *)*pp_Var3,indent + 1);
      }
    default:
      return;
    case Function:
      printf("Function %s\n",n[1]._vptr_Node);
      n = *(Node **)(*(long *)&n[3].kind + 0x18);
    }
    indent = indent + 1;
  } while( true );
switchD_00103cc4_caseD_4:
  printf("BinExpr %c\n",(ulong)(uint)(int)(char)n->field_0xc);
  indent = indent + 1;
  show_ast_node((Node *)n[1]._vptr_Node,indent);
  n = *(Node **)&n[1].kind;
  goto LAB_00103c8f;
}

Assistant:

void show_ast_node(Node* n, int indent)
{
  for (int i=0; i<indent; ++i)
    std::printf("  ");

  switch (n->kind) {

    case NodeKind::UnaryExpr: {
      auto ue = static_cast<UnaryExpr*>(n);
      std::printf("UnaryExpr %c\n", ue->op);
      show_ast_node(ue->operand, indent+1);
      break;
    }

    case NodeKind::BinExpr: {
      auto be = static_cast<BinExpr*>(n);
      std::printf("BinExpr %c\n", be->op);
      show_ast_node(be->lhs, indent+1);
      show_ast_node(be->rhs, indent+1);
      break;
    }

    case NodeKind::Literal: {
      auto l = static_cast<Literal*>(n);
      std::printf("Literal %d\n", l->value);
      break;
    }

    case NodeKind::Return: {
      auto r = static_cast<Return*>(n);
      std::printf("Return\n");
      if (r->expr)
        show_ast_node(r->expr, indent+1);
      break;
    }

    case NodeKind::CompoundStmt: {
      auto e = static_cast<CompoundStmt*>(n);
      std::printf("CompoundStmt\n");
      for (Stmt* stmt : e->stmts) {
        show_ast_node(stmt, indent+1);
      }
      break;
    }

    case NodeKind::Function: {
      auto f = static_cast<FunctionNode*>(n);
      std::printf("Function %s\n", f->name.c_str());
      show_ast_node(f->body->block, indent+1);
      break;
    }

  }
}